

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  StorageKind SVar1;
  pointer puVar2;
  pointer pNVar3;
  size_t sVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  Name memory;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *p_Var7;
  _Head_base<0UL,_wasm::Function_*,_false> _Var8;
  Index index;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var9;
  Type type;
  Const *pCVar10;
  GlobalGet *value;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var11;
  LocalGet *pLVar12;
  Binary *pBVar13;
  Break *any;
  LocalGet *left;
  Load *value_00;
  Store *pSVar14;
  LocalSet *args;
  Block *pBVar15;
  Loop *first;
  If *left_00;
  pointer puVar16;
  ulong uVar17;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Module *pMVar18;
  Name *global;
  pointer pNVar19;
  Address AVar20;
  Signature SVar21;
  Name NVar22;
  string_view sVar23;
  Name name;
  Name name_00;
  Name name_01;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  Name local_1a0;
  string_view local_190;
  HeapType local_180;
  Type local_178;
  IString local_170;
  Name local_160;
  Name local_150;
  Name local_140;
  undefined1 local_130 [8];
  anon_class_16_2_a93e66f6 getAddr;
  size_t local_118;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  Builder local_d0;
  size_t profileSize;
  anon_class_16_2_22e62c78 profileSizeConst;
  Module *pMStack_a8;
  Name loadMemoryName;
  Builder local_90;
  Type ptrType;
  undefined1 auStack_78 [8];
  anon_class_16_2_204a708a getFuncIdx;
  uint local_54;
  Store *local_50;
  _Head_base<0UL,_wasm::Function_*,_false> local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  Index funcIdxVar;
  Builder builder;
  
  local_d0.wasm = (Module *)(numFuncs * 4 + 8);
  AVar20.addr = numFuncs * 4 + 0x10007 >> 0x10;
  pMVar18 = this->wasm;
  puVar2 = (pMVar18->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 == (pMVar18->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    Name::Name(&local_1a0,"0");
    name.super_IString.str._M_str = (char *)local_1a0.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)auStack_78;
    Builder::makeMemory(name,(Address)local_1a0.super_IString.str._M_str,(Address)0x0,false,
                        (Type)0x0);
    wasm::Module::addMemory((unique_ptr *)pMVar18);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)auStack_78);
    pMVar18 = this->wasm;
    _Var9._M_head_impl =
         *(Memory **)
          &(((pMVar18->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    *(address64_t *)((long)_Var9._M_head_impl + 0x38) = AVar20.addr;
  }
  else {
    _Var9._M_head_impl =
         (puVar2->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((AVar20.addr <= ((_Var9._M_head_impl)->initial).addr) ||
       (((_Var9._M_head_impl)->initial).addr = AVar20.addr,
       AVar20.addr <= ((_Var9._M_head_impl)->max).addr)) goto LAB_00124c0a;
  }
  ((_Var9._M_head_impl)->max).addr = AVar20.addr;
LAB_00124c0a:
  local_90.wasm = *(Module **)&(_Var9._M_head_impl)->addressType;
  IString::IString((IString *)&local_190,&this->config->profileExport);
  sVar23 = (string_view)Names::getValidFunctionName(pMVar18,(Name)local_190);
  pMStack_a8 = local_90.wasm;
  loadMemoryName.super_IString.str._M_len = 2;
  wasm::Type::Type(&local_178,&pMStack_a8,2);
  SVar21.results.id = 2;
  SVar21.params.id = local_178.id;
  wasm::HeapType::HeapType(&local_180,SVar21);
  _auStack_78 = (string_view)ZEXT816(0);
  getFuncIdx.funcIdxVar = (Index *)0x0;
  name_00.super_IString.str._M_str = (char *)sVar23._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_48;
  unique0x1000125d = sVar23;
  Builder::makeFunction
            (name_00,(HeapType)sVar23._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_180.id,
             (Expression *)auStack_78);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
  _Var8._M_head_impl = local_48._M_head_impl;
  ((local_48._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  Name::Name(&local_150,"addr");
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_150.super_IString.str._M_len;
  wasm::Function::setLocalName((uint)_Var8._M_head_impl,(Name)(auVar6 << 0x40));
  _Var8._M_head_impl = local_48._M_head_impl;
  Name::Name(&local_140,"size");
  NVar22.super_IString.str._M_str = (char *)local_140.super_IString.str._M_len;
  NVar22.super_IString.str._M_len = 1;
  wasm::Function::setLocalName((uint)_Var8._M_head_impl,NVar22);
  _funcIdxVar = this->wasm;
  local_130 = (undefined1  [8])&funcIdxVar;
  getAddr.builder = &local_90;
  profileSizeConst.builder = &local_d0;
  profileSize = (size_t)local_130;
  type.id = (uintptr_t)
            addProfileExport::anon_class_16_2_a93e66f6::operator()
                      ((anon_class_16_2_a93e66f6 *)local_130);
  pCVar10 = Builder::makeConst<long>((Builder *)&funcIdxVar,this->moduleHash);
  local_54 = 8;
  local_50 = Builder::makeStore((Builder *)&funcIdxVar,8,(Address)0x0,1,(Expression *)type.id,
                                (Expression *)pCVar10,(Type)0x3,
                                (Name)*(string_view *)
                                       (((this->wasm->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t);
  _Var8._M_head_impl = local_48._M_head_impl;
  SVar1 = this->config->storageKind;
  if (SVar1 - InMemory < 2) {
    Name::Name((Name *)&getAddr.ptrType,"funcIdx");
    name_01.super_IString.str._M_str = (char *)0x2;
    name_01.super_IString.str._M_len = local_118;
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ =
         Builder::addVar((Builder *)_Var8._M_head_impl,(Function *)getAddr.ptrType,name_01,type);
    getFuncIdx.builder = (Builder *)&writeProfile;
    auStack_78 = (undefined1  [8])&funcIdxVar;
    if (this->config->storageKind == InMemory) {
      _Var11._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var11._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    pMStack_a8 = *(Module **)
                  _Var11._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    loadMemoryName.super_IString.str._M_len =
         *(size_t *)
          ((long)_Var11._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    Name::Name((Name *)&local_110,"outer");
    Name::Name((Name *)&local_100,"l");
    Name::Name((Name *)&local_f0,"outer");
    pLVar12 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)auStack_78);
    pCVar10 = Builder::makeConst<unsigned_int>((Builder *)&funcIdxVar,(uint)numFuncs);
    pBVar13 = Builder::makeBinary((Builder *)&funcIdxVar,EqInt32,(Expression *)pLVar12,
                                  (Expression *)pCVar10);
    any = Builder::makeBreak((Builder *)&funcIdxVar,(Name)local_f0,(Expression *)0x0,
                             (Expression *)pBVar13);
    pLVar12 = addProfileExport::anon_class_16_2_a93e66f6::operator()
                        ((anon_class_16_2_a93e66f6 *)local_130);
    left = addProfileExport::anon_class_16_2_204a708a::operator()
                     ((anon_class_16_2_204a708a *)auStack_78);
    pCVar10 = Builder::makeConst<unsigned_int>((Builder *)&funcIdxVar,4);
    pBVar13 = Builder::makeBinary((Builder *)&funcIdxVar,MulInt32,(Expression *)left,
                                  (Expression *)pCVar10);
    pBVar13 = Builder::makeBinary((Builder *)&funcIdxVar,AddInt32,(Expression *)pLVar12,
                                  (Expression *)pBVar13);
    pLVar12 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)auStack_78);
    memory.super_IString.str._M_str = (char *)loadMemoryName.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)pMStack_a8;
    value_00 = Builder::makeLoad((Builder *)&funcIdxVar,1,false,(Address)0x0,1,(Expression *)pLVar12
                                 ,(Type)0x2,memory);
    value_00->isAtomic = true;
    pSVar14 = Builder::makeStore((Builder *)&funcIdxVar,4,(Address)0x8,4,(Expression *)pBVar13,
                                 (Expression *)value_00,(Type)0x2,
                                 (Name)*(string_view *)
                                        (((this->wasm->memories).
                                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                        ._M_t);
    index = (Index)writeProfile._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pLVar12 = addProfileExport::anon_class_16_2_204a708a::operator()
                        ((anon_class_16_2_204a708a *)auStack_78);
    pCVar10 = Builder::makeConst<unsigned_int>((Builder *)&funcIdxVar,1);
    pBVar13 = Builder::makeBinary((Builder *)&funcIdxVar,AddInt32,(Expression *)pLVar12,
                                  (Expression *)pCVar10);
    args = Builder::makeLocalSet((Builder *)&funcIdxVar,index,(Expression *)pBVar13);
    Name::Name((Name *)&local_e0,"l");
    type.id = (uintptr_t)
              Builder::makeBreak((Builder *)&funcIdxVar,(Name)local_e0,(Expression *)0x0,
                                 (Expression *)0x0);
    pBVar15 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        ((Builder *)&funcIdxVar,(Expression *)any,(Expression *)pSVar14,args,
                         (Break *)type.id);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)type.id;
    first = Builder::makeLoop((Builder *)&funcIdxVar,(Name)local_100,(Expression *)pBVar15,type_00);
    pBVar15 = Builder::makeBlock((Builder *)&funcIdxVar,(Name)local_110,(Expression *)first);
    local_50 = (Store *)Builder::blockify((Builder *)&funcIdxVar,(Expression *)local_50,
                                          (Expression *)pBVar15);
  }
  else if (SVar1 == InGlobals) {
    pNVar3 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pNVar19 = (this->functionGlobals).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start; pNVar19 != pNVar3; pNVar19 = pNVar19 + 1) {
      type.id = (uintptr_t)
                addProfileExport::anon_class_16_2_a93e66f6::operator()
                          ((anon_class_16_2_a93e66f6 *)local_130);
      sVar4 = (pNVar19->super_IString).str._M_len;
      pcVar5 = (pNVar19->super_IString).str._M_str;
      value = MixedArena::alloc<wasm::GlobalGet>(&_funcIdxVar->allocator);
      AVar20.addr._4_4_ = 0;
      AVar20.addr._0_4_ = local_54;
      (value->name).super_IString.str._M_len = sVar4;
      (value->name).super_IString.str._M_str = pcVar5;
      (value->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = 2;
      pSVar14 = Builder::makeStore((Builder *)&funcIdxVar,4,AVar20,1,(Expression *)type.id,
                                   (Expression *)value,(Type)0x2,
                                   (Name)*(string_view *)
                                          (((this->wasm->memories).
                                            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                          ._M_t);
      local_50 = (Store *)Builder::blockify((Builder *)&funcIdxVar,(Expression *)local_50,
                                            (Expression *)pSVar14);
      local_54 = local_54 + 4;
    }
  }
  pLVar12 = Builder::makeLocalGet((Builder *)&funcIdxVar,1,(Type)0x2);
  pCVar10 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&profileSize);
  pBVar13 = Builder::makeBinary((Builder *)&funcIdxVar,GeUInt32,(Expression *)pLVar12,
                                (Expression *)pCVar10);
  uVar17 = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)type.id;
  left_00 = Builder::makeIf((Builder *)&funcIdxVar,(Expression *)pBVar13,(Expression *)local_50,
                            (Expression *)0x0,type_01);
  pCVar10 = addProfileExport::anon_class_16_2_22e62c78::operator()
                      ((anon_class_16_2_22e62c78 *)&profileSize);
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar17;
  pBVar15 = Builder::makeSequence
                      ((Builder *)&funcIdxVar,(Expression *)left_00,(Expression *)pCVar10,type_02);
  (local_48._M_head_impl)->body = (Expression *)pBVar15;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar18 = this->wasm;
  IString::IString(&local_170,&this->config->profileExport);
  _auStack_78 = stack0xffffffffffffff48;
  getFuncIdx.funcIdxVar = (Index *)((ulong)getFuncIdx.funcIdxVar & 0xffffffffffffff00);
  pMStack_a8 = (Module *)local_170.str._M_len;
  loadMemoryName.super_IString.str._M_len = (size_t)local_170.str._M_str;
  ptrType.id._4_4_ = 0;
  std::
  make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
            ((Name *)&writeProfile,(ExternalKind *)&pMStack_a8,
             (variant<wasm::Name,_wasm::HeapType> *)((long)&ptrType.id + 4));
  wasm::Module::addExport((unique_ptr *)pMVar18);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&writeProfile);
  pMVar18 = this->wasm;
  if (*(long *)((long)(((pMVar18->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    puVar16 = (pMVar18->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar16 ==
          (pMVar18->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Name::Name(&local_160,"profile-memory");
        _auStack_78 = (string_view)
                      Names::getValidExportName
                                (this->wasm,
                                 (IString)*(IString *)
                                           (((this->wasm->memories).
                                             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                           ._M_t);
        getFuncIdx.funcIdxVar = (Index *)((ulong)getFuncIdx.funcIdxVar & 0xffffffffffffff00);
        pMStack_a8 = (Module *)local_160.super_IString.str._M_len;
        loadMemoryName.super_IString.str._M_len = (size_t)local_160.super_IString.str._M_str;
        ptrType.id._4_4_ = 2;
        std::
        make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                  ((Name *)&writeProfile,(ExternalKind *)&pMStack_a8,
                   (variant<wasm::Name,_wasm::HeapType> *)((long)&ptrType.id + 4));
        wasm::Module::addExport((unique_ptr *)pMVar18);
        std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                  ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&writeProfile);
        break;
      }
      p_Var7 = &puVar16->_M_t;
      puVar16 = puVar16 + 1;
    } while (((p_Var7->super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t
              .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind != Memory);
  }
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_48);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  auto ptrType = wasm->memories[0]->addressType;

  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile =
    Builder::makeFunction(name, Signature({ptrType, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, ptrType); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}